

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper.hpp
# Opt level: O1

void __thiscall
pstore::in_memory_mapper::in_memory_mapper
          (in_memory_mapper *this,in_memory *file,bool write_enabled,uint64_t offset,uint64_t length
          )

{
  _func_int **local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  pointer((in_memory_mapper *)&local_38,file,offset);
  (this->super_memory_mapper_base)._vptr_memory_mapper_base =
       (_func_int **)&PTR___cxa_pure_virtual_00133b40;
  (this->super_memory_mapper_base).ptr_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_38;
  (this->super_memory_mapper_base).ptr_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_30;
  (this->super_memory_mapper_base).is_writable_ = write_enabled;
  (this->super_memory_mapper_base).offset_ = offset;
  (this->super_memory_mapper_base).size_ = length;
  (this->super_memory_mapper_base)._vptr_memory_mapper_base =
       (_func_int **)&PTR__in_memory_mapper_00133b78;
  return;
}

Assistant:

in_memory_mapper (file::in_memory & file, bool const write_enabled,
                          std::uint64_t const offset, std::uint64_t const length)
                : memory_mapper_base (pointer (file, offset), write_enabled, offset, length) {}